

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_1335b8::modifyType(bool modify_version)

{
  __type _Var1;
  FILE *__stream;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  IoExc *this;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint local_7c;
  ulong local_78;
  string attrib_name;
  fpos_t position;
  fpos_t verflag_pos;
  
  __stream = fopen((anonymous_namespace)::filename_abi_cxx11_,"r+b");
  std::operator<<((ostream *)&std::cout," simulating new part type ");
  std::ostream::flush();
  iVar4 = 4;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    fgetc(__stream);
  }
  fgetpos(__stream,(fpos_t *)&verflag_pos);
  iVar4 = 4;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    fgetc(__stream);
  }
  local_78 = 0;
  do {
    if ((ulong)((DAT_001d7788 - (anonymous_namespace)::headers) / 0x38) <= local_78) {
      return;
    }
    while( true ) {
      attrib_name._M_dataplus._M_p = (pointer)&attrib_name.field_2;
      attrib_name._M_string_length = 0;
      attrib_name.field_2._M_local_buf[0] = '\0';
      uVar5 = 1;
      while (iVar4 = fgetc(__stream), (char)iVar4 != '\0') {
        std::__cxx11::string::push_back((char)&attrib_name);
        uVar5 = uVar5 + 1;
      }
      local_7c = uVar5;
      if (uVar5 == 1) break;
      do {
        iVar4 = fgetc(__stream);
      } while ((char)iVar4 != '\0');
      sVar2 = fread(&local_7c,4,1,__stream);
      if (sVar2 != 1) {
        this = (IoExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::IoExc::IoExc(this,"unable to read length of attribute");
        __cxa_throw(this,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
      }
      if (Imf_3_2::GLOBAL_SYSTEM_LITTLE_ENDIAN == '\0') {
        local_7c = local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                   local_7c << 0x18;
      }
      if (modify_version) {
        bVar6 = std::operator==(&attrib_name,"version");
        if (bVar6) {
          fgetpos(__stream,(fpos_t *)&position);
          fsetpos(__stream,(fpos_t *)&position);
          fputc(0x58,__stream);
          fclose(__stream);
          std::operator<<((ostream *)&std::cerr," modified ");
          goto LAB_0015cf59;
        }
      }
      else {
        bVar6 = std::operator==(&attrib_name,"type");
        if (bVar6) {
          fgetpos(__stream,(fpos_t *)&position);
          fsetpos(__stream,(fpos_t *)&position);
          fputc(0x58,__stream);
          if (DAT_001d7788 - (anonymous_namespace)::headers == 0x38) {
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Imf_3_2::Header::type_abi_cxx11_();
            _Var1 = std::operator==(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)Imf_3_2::SCANLINEIMAGE_abi_cxx11_);
            if (!_Var1) {
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Imf_3_2::Header::type_abi_cxx11_();
              _Var1 = std::operator==(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)Imf_3_2::TILEDIMAGE_abi_cxx11_);
              if (!_Var1) goto LAB_0015cefb;
            }
            std::operator<<((ostream *)&std::cerr," flipping header ");
            fsetpos(__stream,(fpos_t *)&verflag_pos);
            fputc(2,__stream);
            fputc(8,__stream);
          }
LAB_0015cefb:
          fclose(__stream);
          std::operator<<((ostream *)&std::cerr," modified ");
LAB_0015cf59:
          std::__cxx11::string::~string((string *)&attrib_name);
          return;
        }
      }
      uVar5 = local_7c;
      if ((int)local_7c < 1) {
        uVar5 = 0;
      }
      while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
        fgetc(__stream);
      }
      std::__cxx11::string::~string((string *)&attrib_name);
    }
    std::__cxx11::string::~string((string *)&attrib_name);
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void
modifyType (bool modify_version)
{
    FILE* f = fopen (filename.c_str (), "r+b");

    cout << " simulating new part type ";
    cout.flush ();

    for (int i = 0; i < 4; i++)
    {
        fgetc (f); // magic number
    }
    fpos_t verflag_pos;
    fgetpos (f, &verflag_pos);
    for (int i = 0; i < 4; i++)
    {
        fgetc (f); // version
    }

    // skip over each header
    for (size_t i = 0; i < headers.size (); i++)
    {
        // read each attribute in header i
        while (1)
        {
            char a;
            int  length = 0;

            std::string attrib_name;
            //name
            do
            {
                a = fgetc (f);
                if (a != '\0') attrib_name += a;
                length++;
            } while (a != '\0');

            // check for end-of-header byte
            if (length == 1) break;

            //type of attribute
            do
            {
                a = fgetc (f);

            } while (a != '\0');

            //length of attribute
            size_t nr = fread (&length, 4, 1, f);
            if (nr != 1)
                throw IEX_NAMESPACE::IoExc (
                    "unable to read length of attribute");
            if (!GLOBAL_SYSTEM_LITTLE_ENDIAN) { length = bswap_32 (length); }

            if (!modify_version && attrib_name == "type")
            {
                // modify the type of part 1 to be 'X<whatevever>'
                fpos_t position;
                fgetpos (f, &position);
                fsetpos (f, &position);
                char x = 'X';
                fwrite (&x, 1, 1, f);

                // need to set the 'not just an image' byte for single part regular image files
                // and clear the tiled bit
                if (headers.size () == 1 &&
                    (headers[0].type () == SCANLINEIMAGE ||
                     headers[0].type () == TILEDIMAGE))
                {
                    cerr << " flipping header ";

                    fsetpos (f, &verflag_pos);
                    char x = 2;
                    char y = 8;
                    fwrite (&x, 1, 1, f);
                    fwrite (&y, 1, 1, f);
                }
                fclose (f);

                cerr << " modified ";
                return;
            }

            if (modify_version && attrib_name == "version")
            {
                fpos_t position;
                fgetpos (f, &position);
                fsetpos (f, &position);
                char x = 'X';
                fwrite (&x, 1, 1, f);
                fclose (f);
                cerr << " modified ";
                return;
            }

            //value of attribute
            for (int i = 0; i < length; i++)
            {
                fgetc (f);
            }
        }
    }
}